

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateLibraryIncludes
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *pLVar2;
  allocator local_5e1;
  string local_5e0;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  allocator local_401;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  int local_1ac [2];
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  allocator local_e9;
  string local_e8;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  allocator local_81;
  string local_80;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = UsingImplicitWeakFields(this->file_,&this->options_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,"net/proto2/public/implicit_weak_message.h",&local_81);
    IncludeFile(this,&local_80,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  bVar1 = HasWeakFields(this->file_,&this->options_);
  if (bVar1) {
    local_c1 = 0;
    if (((this->options_).opensource_runtime & 1U) != 0) {
      internal::LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x478);
      local_c1 = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_c0,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=(&local_c2,pLVar2);
    }
    if ((local_c1 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_c0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"net/proto2/public/weak_field_map.h",&local_e9)
    ;
    IncludeFile(this,&local_e8,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  bVar1 = HasLazyFields(this->file_,&this->options_,&this->scc_analyzer_);
  if (bVar1) {
    local_129 = 0;
    if (((this->options_).opensource_runtime & 1U) != 0) {
      internal::LogMessage::LogMessage
                (&local_128,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,0x47c);
      local_129 = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_128,"CHECK failed: !options_.opensource_runtime: ");
      internal::LogFinisher::operator=(&local_12a,pLVar2);
    }
    if ((local_129 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_128);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"net/proto2/public/lazy_field.h",&local_151);
    IncludeFile(this,&local_150,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  bVar1 = ShouldVerify(this->file_,&this->options_,&this->scc_analyzer_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_178,"net/proto2/public/wire_format_verify.h",&local_179);
    IncludeFile(this,&local_178,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
  }
  if (((this->options_).opensource_runtime & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,"net/proto2/public/port_def.inc",&local_1a1);
    IncludeFile(this,&local_1a0,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    local_1ac[1] = 0x2e10f8;
    local_1ac[0] = 0x2e10f8;
    Formatter::operator()
              ((Formatter *)local_50,
               "#if PROTOBUF_VERSION < $1$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please update\n#error your headers.\n#endif\n#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers. Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
               ,local_1ac + 1,local_1ac);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"net/proto2/public/port_undef.inc",&local_1d1)
    ;
    IncludeFile(this,&local_1d0,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"net/proto2/io/public/coded_stream.h",&local_1f9);
  IncludeFile(this,&local_1f8,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"net/proto2/public/arena.h",&local_221);
  IncludeFile(this,&local_220,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"net/proto2/public/arenastring.h",&local_249);
  IncludeFile(this,&local_248,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((((this->options_).force_inline_string & 1U) != 0) ||
      (((this->options_).profile_driven_inline_string & 1U) != 0)) &&
     (((this->options_).opensource_runtime & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_270,"net/proto2/public/inlined_string_field.h",&local_271);
    IncludeFile(this,&local_270,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
  }
  bVar1 = HasSimpleBaseClasses(this->file_,&this->options_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_298,"net/proto2/public/generated_message_bases.h",&local_299);
    IncludeFile(this,&local_298,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,"net/proto2/public/generated_message_table_driven.h",&local_2c1);
  IncludeFile(this,&local_2c0,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  bVar1 = HasGeneratedMethods(this->file_,&this->options_);
  if ((bVar1) && ((this->options_).tctable_mode != kTCTableNever)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e8,"net/proto2/public/generated_message_tctable_decl.h",&local_2e9)
    ;
    IncludeFile(this,&local_2e8,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_310,"net/proto2/public/generated_message_util.h",&local_311);
  IncludeFile(this,&local_310,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"net/proto2/public/metadata_lite.h",&local_339);
  IncludeFile(this,&local_338,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  bVar1 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_360,"net/proto2/public/generated_message_reflection.h",&local_361);
    IncludeFile(this,&local_360,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
  }
  bVar1 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  if (!bVar1) {
    bVar1 = HasDescriptorMethods(this->file_,&this->options_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_388,"net/proto2/public/message.h",&local_389);
      IncludeFile(this,&local_388,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3b0,"net/proto2/public/message_lite.h",&local_3b1);
      IncludeFile(this,&local_3b0,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    }
  }
  if (((this->options_).opensource_runtime & 1U) == 0) {
    bVar1 = HasExtensionsOrExtendableMessage(this->file_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_428,"net/proto2/public/extension_set.h",&local_429);
      IncludeFileAndExport
                (this,&local_428,
                 (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
    }
    bVar1 = HasRepeatedFields(this->file_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_450,"net/proto2/public/repeated_field.h",&local_451);
      IncludeFileAndExport
                (this,&local_450,
                 (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
    }
    bVar1 = HasStringPieceFields(this->file_,&this->options_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_478,"net/proto2/public/string_piece_field_support.h",&local_479);
      IncludeFile(this,&local_478,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    bVar1 = HasCordFields(this->file_,&this->options_);
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,"#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3d8,"net/proto2/public/repeated_field.h",&local_3d9);
    IncludeFileAndExport
              (this,&local_3d8,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_400,"net/proto2/public/extension_set.h",&local_401);
    IncludeFileAndExport
              (this,&local_400,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
  }
  bVar1 = HasMapFields(this->file_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"net/proto2/public/map.h",&local_4a1);
    IncludeFileAndExport
              (this,&local_4a0,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    bVar1 = HasDescriptorMethods(this->file_,&this->options_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c8,"net/proto2/public/map_entry.h",&local_4c9);
      IncludeFile(this,&local_4c8,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4f0,"net/proto2/public/map_field_inl.h",&local_4f1);
      IncludeFile(this,&local_4f0,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_518,"net/proto2/public/map_entry_lite.h",&local_519);
      IncludeFile(this,&local_518,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_540,"net/proto2/public/map_field_lite.h",&local_541);
      IncludeFile(this,&local_540,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator((allocator<char> *)&local_541);
    }
  }
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    bVar1 = HasDescriptorMethods(this->file_,&this->options_);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_568,"net/proto2/public/generated_enum_reflection.h",&local_569);
      IncludeFile(this,&local_568,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_590,"net/proto2/public/generated_enum_util.h",&local_591);
      IncludeFile(this,&local_590,
                  (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
    }
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5b8,"net/proto2/public/service.h",&local_5b9);
    IncludeFile(this,&local_5b8,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  }
  bVar1 = UseUnknownFieldSet(this->file_,&this->options_);
  if ((bVar1) &&
     (bVar1 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::empty(&this->message_generators_), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_5e0,"net/proto2/public/unknown_field_set.h",&local_5e1);
    IncludeFile(this,&local_5e0,
                (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateLibraryIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (UsingImplicitWeakFields(file_, options_)) {
    IncludeFile("net/proto2/public/implicit_weak_message.h", printer);
  }
  if (HasWeakFields(file_, options_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/weak_field_map.h", printer);
  }
  if (HasLazyFields(file_, options_, &scc_analyzer_)) {
    GOOGLE_CHECK(!options_.opensource_runtime);
    IncludeFile("net/proto2/public/lazy_field.h", printer);
  }
  if (ShouldVerify(file_, options_, &scc_analyzer_)) {
    IncludeFile("net/proto2/public/wire_format_verify.h", printer);
  }

  if (options_.opensource_runtime) {
    // Verify the protobuf library header version is compatible with the protoc
    // version before going any further.
    IncludeFile("net/proto2/public/port_def.inc", printer);
    format(
        "#if PROTOBUF_VERSION < $1$\n"
        "#error This file was generated by a newer version of protoc which is\n"
        "#error incompatible with your Protocol Buffer headers. Please update\n"
        "#error your headers.\n"
        "#endif\n"
        "#if $2$ < PROTOBUF_MIN_PROTOC_VERSION\n"
        "#error This file was generated by an older version of protoc which "
        "is\n"
        "#error incompatible with your Protocol Buffer headers. Please\n"
        "#error regenerate this file with a newer version of protoc.\n"
        "#endif\n"
        "\n",
        PROTOBUF_MIN_HEADER_VERSION_FOR_PROTOC,  // 1
        PROTOBUF_VERSION);                       // 2
    IncludeFile("net/proto2/public/port_undef.inc", printer);
  }

  // OK, it's now safe to #include other files.
  IncludeFile("net/proto2/io/public/coded_stream.h", printer);
  IncludeFile("net/proto2/public/arena.h", printer);
  IncludeFile("net/proto2/public/arenastring.h", printer);
  if ((options_.force_inline_string || options_.profile_driven_inline_string) &&
      !options_.opensource_runtime) {
    IncludeFile("net/proto2/public/inlined_string_field.h", printer);
  }
  if (HasSimpleBaseClasses(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_bases.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_table_driven.h", printer);
  if (HasGeneratedMethods(file_, options_) &&
      options_.tctable_mode != Options::kTCTableNever) {
    IncludeFile("net/proto2/public/generated_message_tctable_decl.h", printer);
  }
  IncludeFile("net/proto2/public/generated_message_util.h", printer);
  IncludeFile("net/proto2/public/metadata_lite.h", printer);

  if (HasDescriptorMethods(file_, options_)) {
    IncludeFile("net/proto2/public/generated_message_reflection.h", printer);
  }

  if (!message_generators_.empty()) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/message.h", printer);
    } else {
      IncludeFile("net/proto2/public/message_lite.h", printer);
    }
  }
  if (options_.opensource_runtime) {
    // Open-source relies on unconditional includes of these.
    IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
  } else {
    // Google3 includes these files only when they are necessary.
    if (HasExtensionsOrExtendableMessage(file_)) {
      IncludeFileAndExport("net/proto2/public/extension_set.h", printer);
    }
    if (HasRepeatedFields(file_)) {
      IncludeFileAndExport("net/proto2/public/repeated_field.h", printer);
    }
    if (HasStringPieceFields(file_, options_)) {
      IncludeFile("net/proto2/public/string_piece_field_support.h", printer);
    }
    if (HasCordFields(file_, options_)) {
      format("#include \"third_party/absl/strings/cord.h\"\n");
    }
  }
  if (HasMapFields(file_)) {
    IncludeFileAndExport("net/proto2/public/map.h", printer);
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/map_entry.h", printer);
      IncludeFile("net/proto2/public/map_field_inl.h", printer);
    } else {
      IncludeFile("net/proto2/public/map_entry_lite.h", printer);
      IncludeFile("net/proto2/public/map_field_lite.h", printer);
    }
  }

  if (HasEnumDefinitions(file_)) {
    if (HasDescriptorMethods(file_, options_)) {
      IncludeFile("net/proto2/public/generated_enum_reflection.h", printer);
    } else {
      IncludeFile("net/proto2/public/generated_enum_util.h", printer);
    }
  }

  if (HasGenericServices(file_, options_)) {
    IncludeFile("net/proto2/public/service.h", printer);
  }

  if (UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    IncludeFile("net/proto2/public/unknown_field_set.h", printer);
  }
}